

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O1

int N_VLinearCombination(int nvec,realtype *c,N_Vector *X,N_Vector z)

{
  _func_int_int_realtype_ptr_N_Vector_ptr_N_Vector *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  
  UNRECOVERED_JUMPTABLE = z->ops->nvlinearcombination;
  if (UNRECOVERED_JUMPTABLE != (_func_int_int_realtype_ptr_N_Vector_ptr_N_Vector *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,c,X,z);
    return iVar1;
  }
  (*z->ops->nvscale)(*c,*X,z);
  if (1 < nvec) {
    uVar2 = 1;
    do {
      (*z->ops->nvlinearsum)(c[uVar2],X[uVar2],1.0,z,z);
      uVar2 = uVar2 + 1;
    } while ((uint)nvec != uVar2);
  }
  return 0;
}

Assistant:

int N_VLinearCombination(int nvec, realtype* c, N_Vector* X, N_Vector z)
{
  int i, ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (z->ops->nvlinearcombination != NULL) {

    ier = z->ops->nvlinearcombination(nvec, c, X, z);

  } else {

    z->ops->nvscale(c[0], X[0], z);
    for (i=1; i<nvec; i++) {
      z->ops->nvlinearsum(c[i], X[i], RCONST(1.0), z, z);
    }
    ier = 0;

  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return(ier);
}